

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_button_symbol
               (nk_command_buffer *out,nk_rect *bounds,nk_rect *content,nk_flags state,
               nk_style_button *style,nk_symbol_type type,nk_user_font *font)

{
  nk_style_button *in_RDI;
  nk_flags unaff_retaddr;
  nk_rect *in_stack_00000008;
  nk_command_buffer *in_stack_00000010;
  nk_style_item *background;
  nk_color bg;
  nk_color sym;
  nk_user_font *in_stack_000000c8;
  float in_stack_000000d0;
  nk_symbol_type in_stack_000000d4;
  nk_command_buffer *in_stack_000000d8;
  nk_color in_stack_000000e0;
  nk_color in_stack_000000e4;
  undefined1 in_stack_000000e8 [16];
  
  nk_draw_button(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI);
  nk_draw_symbol(in_stack_000000d8,in_stack_000000d4,(nk_rect)in_stack_000000e8,in_stack_000000e4,
                 in_stack_000000e0,in_stack_000000d0,in_stack_000000c8);
  return;
}

Assistant:

NK_INTERN void
nk_draw_button_symbol(struct nk_command_buffer *out,
    const struct nk_rect *bounds, const struct nk_rect *content,
    nk_flags state, const struct nk_style_button *style,
    enum nk_symbol_type type, const struct nk_user_font *font)
{
    struct nk_color sym, bg;
    const struct nk_style_item *background;

    /* select correct colors/images */
    background = nk_draw_button(out, bounds, state, style);
    if (background->type == NK_STYLE_ITEM_COLOR)
        bg = background->data.color;
    else bg = style->text_background;

    if (state & NK_WIDGET_STATE_HOVER)
        sym = style->text_hover;
    else if (state & NK_WIDGET_STATE_ACTIVED)
        sym = style->text_active;
    else sym = style->text_normal;
    nk_draw_symbol(out, type, *content, bg, sym, 1, font);
}